

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

bool ImGui_ImplGlfw_Init(GLFWwindow *window,bool install_callbacks,GlfwClientApi client_api)

{
  ImGuiIO *pIVar1;
  GLFWerrorfun cbfun;
  GLFWerrorfun prev_error_callback;
  ImGuiIO *io;
  GlfwClientApi client_api_local;
  bool install_callbacks_local;
  GLFWwindow *window_local;
  
  g_Time = 0.0;
  g_Window = window;
  pIVar1 = ImGui::GetIO();
  pIVar1->BackendFlags = pIVar1->BackendFlags | 2;
  pIVar1->BackendFlags = pIVar1->BackendFlags | 4;
  pIVar1->BackendPlatformName = "imgui_impl_glfw";
  pIVar1->KeyMap[0] = 0x102;
  pIVar1->KeyMap[1] = 0x107;
  pIVar1->KeyMap[2] = 0x106;
  pIVar1->KeyMap[3] = 0x109;
  pIVar1->KeyMap[4] = 0x108;
  pIVar1->KeyMap[5] = 0x10a;
  pIVar1->KeyMap[6] = 0x10b;
  pIVar1->KeyMap[7] = 0x10c;
  pIVar1->KeyMap[8] = 0x10d;
  pIVar1->KeyMap[9] = 0x104;
  pIVar1->KeyMap[10] = 0x105;
  pIVar1->KeyMap[0xb] = 0x103;
  pIVar1->KeyMap[0xc] = 0x20;
  pIVar1->KeyMap[0xd] = 0x101;
  pIVar1->KeyMap[0xe] = 0x100;
  pIVar1->KeyMap[0xf] = 0x14f;
  pIVar1->KeyMap[0x10] = 0x41;
  pIVar1->KeyMap[0x11] = 0x43;
  pIVar1->KeyMap[0x12] = 0x56;
  pIVar1->KeyMap[0x13] = 0x58;
  pIVar1->KeyMap[0x14] = 0x59;
  pIVar1->KeyMap[0x15] = 0x5a;
  pIVar1->SetClipboardTextFn = ImGui_ImplGlfw_SetClipboardText;
  pIVar1->GetClipboardTextFn = ImGui_ImplGlfw_GetClipboardText;
  pIVar1->ClipboardUserData = g_Window;
  cbfun = glfwSetErrorCallback((GLFWerrorfun)0x0);
  g_MouseCursors[0] = glfwCreateStandardCursor(0x36001);
  g_MouseCursors[1] = glfwCreateStandardCursor(0x36002);
  g_MouseCursors[3] = glfwCreateStandardCursor(0x36006);
  g_MouseCursors[4] = glfwCreateStandardCursor(0x36005);
  g_MouseCursors[7] = glfwCreateStandardCursor(0x36004);
  g_MouseCursors[2] = glfwCreateStandardCursor(0x36001);
  g_MouseCursors[5] = glfwCreateStandardCursor(0x36001);
  g_MouseCursors[6] = glfwCreateStandardCursor(0x36001);
  g_MouseCursors[8] = glfwCreateStandardCursor(0x36001);
  glfwSetErrorCallback(cbfun);
  g_PrevUserCallbackMousebutton = (GLFWmousebuttonfun)0x0;
  g_PrevUserCallbackScroll = (GLFWscrollfun)0x0;
  g_PrevUserCallbackKey = (GLFWkeyfun)0x0;
  g_PrevUserCallbackChar = (GLFWcharfun)0x0;
  if (install_callbacks) {
    g_InstalledCallbacks = true;
    g_PrevUserCallbackMousebutton =
         glfwSetMouseButtonCallback(window,ImGui_ImplGlfw_MouseButtonCallback);
    g_PrevUserCallbackScroll = glfwSetScrollCallback(window,ImGui_ImplGlfw_ScrollCallback);
    g_PrevUserCallbackKey = glfwSetKeyCallback(window,ImGui_ImplGlfw_KeyCallback);
    g_PrevUserCallbackChar = glfwSetCharCallback(window,ImGui_ImplGlfw_CharCallback);
  }
  g_ClientApi = client_api;
  return true;
}

Assistant:

static bool ImGui_ImplGlfw_Init(GLFWwindow* window, bool install_callbacks, GlfwClientApi client_api)
{
    g_Window = window;
    g_Time = 0.0;

    // Setup backend capabilities flags
    ImGuiIO& io = ImGui::GetIO();
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;         // We can honor GetMouseCursor() values (optional)
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;          // We can honor io.WantSetMousePos requests (optional, rarely used)
    io.BackendPlatformName = "imgui_impl_glfw";

    // Keyboard mapping. Dear ImGui will use those indices to peek into the io.KeysDown[] array.
    io.KeyMap[ImGuiKey_Tab] = GLFW_KEY_TAB;
    io.KeyMap[ImGuiKey_LeftArrow] = GLFW_KEY_LEFT;
    io.KeyMap[ImGuiKey_RightArrow] = GLFW_KEY_RIGHT;
    io.KeyMap[ImGuiKey_UpArrow] = GLFW_KEY_UP;
    io.KeyMap[ImGuiKey_DownArrow] = GLFW_KEY_DOWN;
    io.KeyMap[ImGuiKey_PageUp] = GLFW_KEY_PAGE_UP;
    io.KeyMap[ImGuiKey_PageDown] = GLFW_KEY_PAGE_DOWN;
    io.KeyMap[ImGuiKey_Home] = GLFW_KEY_HOME;
    io.KeyMap[ImGuiKey_End] = GLFW_KEY_END;
    io.KeyMap[ImGuiKey_Insert] = GLFW_KEY_INSERT;
    io.KeyMap[ImGuiKey_Delete] = GLFW_KEY_DELETE;
    io.KeyMap[ImGuiKey_Backspace] = GLFW_KEY_BACKSPACE;
    io.KeyMap[ImGuiKey_Space] = GLFW_KEY_SPACE;
    io.KeyMap[ImGuiKey_Enter] = GLFW_KEY_ENTER;
    io.KeyMap[ImGuiKey_Escape] = GLFW_KEY_ESCAPE;
    io.KeyMap[ImGuiKey_KeyPadEnter] = GLFW_KEY_KP_ENTER;
    io.KeyMap[ImGuiKey_A] = GLFW_KEY_A;
    io.KeyMap[ImGuiKey_C] = GLFW_KEY_C;
    io.KeyMap[ImGuiKey_V] = GLFW_KEY_V;
    io.KeyMap[ImGuiKey_X] = GLFW_KEY_X;
    io.KeyMap[ImGuiKey_Y] = GLFW_KEY_Y;
    io.KeyMap[ImGuiKey_Z] = GLFW_KEY_Z;

    io.SetClipboardTextFn = ImGui_ImplGlfw_SetClipboardText;
    io.GetClipboardTextFn = ImGui_ImplGlfw_GetClipboardText;
    io.ClipboardUserData = g_Window;
#if defined(_WIN32)
    io.ImeWindowHandle = (void*)glfwGetWin32Window(g_Window);
#endif

    // Create mouse cursors
    // (By design, on X11 cursors are user configurable and some cursors may be missing. When a cursor doesn't exist,
    // GLFW will emit an error which will often be printed by the app, so we temporarily disable error reporting.
    // Missing cursors will return NULL and our _UpdateMouseCursor() function will use the Arrow cursor instead.)
    GLFWerrorfun prev_error_callback = glfwSetErrorCallback(NULL);
    g_MouseCursors[ImGuiMouseCursor_Arrow] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_TextInput] = glfwCreateStandardCursor(GLFW_IBEAM_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNS] = glfwCreateStandardCursor(GLFW_VRESIZE_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeEW] = glfwCreateStandardCursor(GLFW_HRESIZE_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_Hand] = glfwCreateStandardCursor(GLFW_HAND_CURSOR);
#if GLFW_HAS_NEW_CURSORS
    g_MouseCursors[ImGuiMouseCursor_ResizeAll] = glfwCreateStandardCursor(GLFW_RESIZE_ALL_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNESW] = glfwCreateStandardCursor(GLFW_RESIZE_NESW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNWSE] = glfwCreateStandardCursor(GLFW_RESIZE_NWSE_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_NotAllowed] = glfwCreateStandardCursor(GLFW_NOT_ALLOWED_CURSOR);
#else
    g_MouseCursors[ImGuiMouseCursor_ResizeAll] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNESW] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNWSE] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_NotAllowed] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
#endif
    glfwSetErrorCallback(prev_error_callback);

    // Chain GLFW callbacks: our callbacks will call the user's previously installed callbacks, if any.
    g_PrevUserCallbackMousebutton = NULL;
    g_PrevUserCallbackScroll = NULL;
    g_PrevUserCallbackKey = NULL;
    g_PrevUserCallbackChar = NULL;
    if (install_callbacks)
    {
        g_InstalledCallbacks = true;
        g_PrevUserCallbackMousebutton = glfwSetMouseButtonCallback(window, ImGui_ImplGlfw_MouseButtonCallback);
        g_PrevUserCallbackScroll = glfwSetScrollCallback(window, ImGui_ImplGlfw_ScrollCallback);
        g_PrevUserCallbackKey = glfwSetKeyCallback(window, ImGui_ImplGlfw_KeyCallback);
        g_PrevUserCallbackChar = glfwSetCharCallback(window, ImGui_ImplGlfw_CharCallback);
    }

    g_ClientApi = client_api;
    return true;
}